

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuResource.cpp
# Opt level: O2

void __thiscall tcu::FileResource::FileResource(FileResource *this,char *filename)

{
  FILE *pFVar1;
  ResourceError *this_00;
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,filename,&local_39);
  Resource::Resource(&this->super_Resource,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Resource)._vptr_Resource = (_func_int **)&PTR__FileResource_0072eb08;
  pFVar1 = fopen(filename,"rb");
  this->m_file = (FILE *)pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    return;
  }
  this_00 = (ResourceError *)__cxa_allocate_exception(0x38);
  ResourceError::ResourceError
            (this_00,"Failed to open file",filename,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuResource.cpp"
             ,0x35);
  __cxa_throw(this_00,&ResourceError::typeinfo,Exception::~Exception);
}

Assistant:

FileResource::FileResource (const char* filename)
	: Resource(std::string(filename))
{
	m_file = fopen(filename, "rb");
	if (!m_file)
		throw ResourceError("Failed to open file", filename, __FILE__, __LINE__);
}